

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

SobolSampler *
pbrt::SobolSampler::Create
          (ParameterDictionary *parameters,Point2i *fullResolution,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  int samplesPerPixel;
  RandomizeStrategy randomizeStrategy;
  string s;
  string local_a0;
  FileLoc *local_80;
  Point2i *local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"pixelsamples","");
  iVar2 = ParameterDictionary::GetOneInt(parameters,&local_a0,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(Options + 0x20) == '\x01') {
    iVar2 = *(int *)(Options + 0x1c);
  }
  samplesPerPixel = 1;
  if (*(char *)(Options + 0x2c) == '\0') {
    samplesPerPixel = iVar2;
  }
  local_80 = loc;
  local_78 = fullResolution;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"randomization","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fastowen","");
  ParameterDictionary::GetOneString(&local_a0,parameters,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_a0);
  if (iVar2 == 0) {
    randomizeStrategy = None;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar2 == 0) {
      randomizeStrategy = CranleyPatterson;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar2 == 0) {
        randomizeStrategy = PermuteDigits;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar2 == 0) {
          randomizeStrategy = FastOwen;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          randomizeStrategy = Owen;
          if (iVar2 != 0) {
            ErrorExit<std::__cxx11::string&>
                      (local_80,"%s: unknown randomization strategy given to SobolSampler",&local_a0
                      );
          }
        }
      }
    }
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  SobolSampler((SobolSampler *)CONCAT44(extraout_var,iVar2),samplesPerPixel,local_78,
               randomizeStrategy);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return (SobolSampler *)CONCAT44(extraout_var,iVar2);
}

Assistant:

SobolSampler *SobolSampler::Create(const ParameterDictionary &parameters,
                                   const Point2i &fullResolution, const FileLoc *loc,
                                   Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to SobolSampler", s);

    return alloc.new_object<SobolSampler>(nsamp, fullResolution, randomizer);
}